

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O3

void sycc422_to_rgb(opj_image_t *img)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  OPJ_UINT32 OVar5;
  opj_image_comp_t *poVar6;
  undefined1 auVar7 [16];
  uint uVar8;
  ulong uVar9;
  uint *puVar10;
  uint *puVar11;
  uint *puVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  int *piVar18;
  int iVar19;
  uint uVar20;
  uint *puVar21;
  uint *puVar22;
  uint *puVar23;
  int *piVar24;
  long lVar25;
  uint uVar26;
  int *piVar27;
  double dVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  undefined1 auVar32 [16];
  
  poVar6 = img->comps;
  bVar1 = (byte)poVar6->prec;
  iVar19 = 1 << (bVar1 - 1 & 0x1f);
  uVar8 = poVar6->w;
  uVar9 = (ulong)poVar6->h;
  piVar18 = poVar6->data;
  piVar24 = poVar6[1].data;
  piVar27 = poVar6[2].data;
  lVar25 = uVar8 * uVar9 * 4;
  puVar10 = (uint *)opj_image_data_alloc(lVar25);
  puVar11 = (uint *)opj_image_data_alloc(lVar25);
  puVar12 = (uint *)opj_image_data_alloc(lVar25);
  if (puVar12 != (uint *)0x0 && (puVar11 != (uint *)0x0 && puVar10 != (uint *)0x0)) {
    if (uVar9 != 0) {
      uVar26 = ~(-1 << (bVar1 & 0x1f));
      uVar20 = img->x0 & 1;
      dVar28 = (double)-iVar19;
      uVar13 = (ulong)uVar8 - (ulong)uVar20;
      uVar14 = uVar13 & 0xfffffffffffffffe;
      uVar16 = 0;
      puVar21 = puVar10;
      puVar22 = puVar11;
      puVar23 = puVar12;
      do {
        uVar15 = uVar16;
        if (uVar20 != 0) {
          iVar2 = *piVar18;
          uVar17 = iVar2 - (int)(dVar28 * 0.344 + dVar28 * 0.714);
          uVar8 = uVar26;
          if ((int)uVar17 < (int)uVar26) {
            uVar8 = uVar17;
          }
          if ((int)uVar17 < 0) {
            uVar8 = 0;
          }
          uVar29 = iVar2 + (int)(dVar28 * 1.772);
          uVar31 = iVar2 + (int)(dVar28 * 1.402);
          uVar30 = uVar31;
          if ((int)uVar26 <= (int)uVar31) {
            uVar30 = uVar26;
          }
          auVar32._4_4_ = uVar29;
          auVar32._0_4_ = uVar29;
          auVar32._8_4_ = uVar31;
          auVar32._12_4_ = uVar31;
          uVar17 = movmskpd(uVar17,auVar32);
          if ((uVar17 & 2) != 0) {
            uVar30 = 0;
          }
          *puVar21 = uVar30;
          *puVar22 = uVar8;
          if ((int)uVar26 <= (int)uVar29) {
            uVar29 = uVar26;
          }
          uVar15 = (ulong)uVar29;
          if ((uVar17 & 1) != 0) {
            uVar15 = 0;
          }
          *puVar23 = (uint)uVar15;
          piVar18 = piVar18 + 1;
          puVar21 = puVar21 + 1;
          puVar22 = puVar22 + 1;
          puVar23 = puVar23 + 1;
        }
        uVar8 = (uint)uVar15;
        if (uVar14 == 0) {
          uVar15 = 0;
        }
        else {
          uVar15 = 0;
          do {
            iVar2 = *piVar27;
            iVar3 = *piVar18;
            uVar17 = (int)((double)(iVar2 - iVar19) * 1.402) + iVar3;
            uVar8 = uVar17;
            if ((int)uVar26 <= (int)uVar17) {
              uVar8 = uVar26;
            }
            uVar30 = 0;
            if (-1 < (int)uVar17) {
              uVar30 = uVar8;
            }
            iVar4 = *piVar24;
            *puVar21 = uVar30;
            uVar17 = iVar3 - (int)((double)(iVar4 - iVar19) * 0.344 +
                                  (double)(iVar2 - iVar19) * 0.714);
            uVar8 = uVar17;
            if ((int)uVar26 <= (int)uVar17) {
              uVar8 = uVar26;
            }
            uVar30 = 0;
            if (-1 < (int)uVar17) {
              uVar30 = uVar8;
            }
            *puVar22 = uVar30;
            uVar17 = iVar3 + (int)((double)(iVar4 - iVar19) * 1.772);
            uVar8 = uVar17;
            if ((int)uVar26 <= (int)uVar17) {
              uVar8 = uVar26;
            }
            uVar30 = 0;
            if (-1 < (int)uVar17) {
              uVar30 = uVar8;
            }
            *puVar23 = uVar30;
            iVar2 = piVar18[1];
            iVar3 = *piVar27;
            iVar4 = *piVar24;
            uVar17 = (int)((double)(iVar3 - iVar19) * 1.402) + iVar2;
            uVar8 = uVar17;
            if ((int)uVar26 <= (int)uVar17) {
              uVar8 = uVar26;
            }
            uVar30 = 0;
            if (-1 < (int)uVar17) {
              uVar30 = uVar8;
            }
            puVar21[1] = uVar30;
            uVar17 = iVar2 - (int)((double)(iVar4 - iVar19) * 0.344 +
                                  (double)(iVar3 - iVar19) * 0.714);
            uVar8 = uVar17;
            if ((int)uVar26 <= (int)uVar17) {
              uVar8 = uVar26;
            }
            uVar30 = 0;
            if (-1 < (int)uVar17) {
              uVar30 = uVar8;
            }
            puVar22[1] = uVar30;
            uVar17 = iVar2 + (int)((double)(iVar4 - iVar19) * 1.772);
            uVar8 = uVar17;
            if ((int)uVar26 <= (int)uVar17) {
              uVar8 = uVar26;
            }
            uVar30 = 0;
            if (-1 < (int)uVar17) {
              uVar30 = uVar8;
            }
            puVar23[1] = uVar30;
            piVar18 = piVar18 + 2;
            puVar21 = puVar21 + 2;
            puVar22 = puVar22 + 2;
            puVar23 = puVar23 + 2;
            piVar24 = piVar24 + 1;
            piVar27 = piVar27 + 1;
            uVar15 = uVar15 + 2;
          } while (uVar15 < uVar14);
        }
        if (uVar15 < uVar13) {
          iVar2 = *piVar18;
          uVar30 = iVar2 + (int)((double)(*piVar24 - iVar19) * 1.772);
          uVar29 = iVar2 + (int)((double)(*piVar27 - iVar19) * 1.402);
          uVar17 = uVar29;
          if ((int)uVar26 <= (int)uVar29) {
            uVar17 = uVar26;
          }
          auVar7._4_4_ = uVar30;
          auVar7._0_4_ = uVar30;
          auVar7._8_4_ = uVar29;
          auVar7._12_4_ = uVar29;
          uVar8 = movmskpd(uVar8,auVar7);
          if ((uVar8 & 2) != 0) {
            uVar17 = 0;
          }
          uVar31 = iVar2 - (int)((double)(*piVar24 - iVar19) * 0.344 +
                                (double)(*piVar27 - iVar19) * 0.714);
          uVar29 = uVar26;
          if ((int)uVar31 < (int)uVar26) {
            uVar29 = uVar31;
          }
          if ((int)uVar31 < 0) {
            uVar29 = 0;
          }
          if ((int)uVar26 <= (int)uVar30) {
            uVar30 = uVar26;
          }
          *puVar21 = uVar17;
          if ((uVar8 & 1) != 0) {
            uVar30 = 0;
          }
          *puVar22 = uVar29;
          *puVar23 = uVar30;
          piVar18 = piVar18 + 1;
          puVar21 = puVar21 + 1;
          puVar22 = puVar22 + 1;
          puVar23 = puVar23 + 1;
          piVar24 = piVar24 + 1;
          piVar27 = piVar27 + 1;
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != uVar9);
    }
    opj_image_data_free(img->comps->data);
    poVar6 = img->comps;
    poVar6->data = (OPJ_INT32 *)puVar10;
    opj_image_data_free(poVar6[1].data);
    poVar6 = img->comps;
    poVar6[1].data = (OPJ_INT32 *)puVar11;
    opj_image_data_free(poVar6[2].data);
    poVar6 = img->comps;
    poVar6[2].data = (OPJ_INT32 *)puVar12;
    poVar6[2].w = poVar6->w;
    poVar6[1].w = poVar6->w;
    poVar6[2].h = poVar6->h;
    poVar6[1].h = poVar6->h;
    OVar5 = poVar6->dy;
    poVar6[2].dx = poVar6->dx;
    poVar6[1].dx = poVar6->dx;
    poVar6[2].dy = OVar5;
    poVar6[1].dy = OVar5;
    img->color_space = OPJ_CLRSPC_SRGB;
    return;
  }
  opj_image_data_free();
  opj_image_data_free(puVar11);
  opj_image_data_free(puVar12);
  return;
}

Assistant:

static void sycc422_to_rgb(opj_image_t *img)
{
    int *d0, *d1, *d2, *r, *g, *b;
    const int *y, *cb, *cr;
    size_t maxw, maxh, max, offx, loopmaxw;
    int offset, upb;
    size_t i;

    upb = (int)img->comps[0].prec;
    offset = 1 << (upb - 1);
    upb = (1 << upb) - 1;

    maxw = (size_t)img->comps[0].w;
    maxh = (size_t)img->comps[0].h;
    max = maxw * maxh;

    y = img->comps[0].data;
    cb = img->comps[1].data;
    cr = img->comps[2].data;

    d0 = r = (int*)opj_image_data_alloc(sizeof(int) * max);
    d1 = g = (int*)opj_image_data_alloc(sizeof(int) * max);
    d2 = b = (int*)opj_image_data_alloc(sizeof(int) * max);

    if (r == NULL || g == NULL || b == NULL) {
        goto fails;
    }

    /* if img->x0 is odd, then first column shall use Cb/Cr = 0 */
    offx = img->x0 & 1U;
    loopmaxw = maxw - offx;

    for (i = 0U; i < maxh; ++i) {
        size_t j;

        if (offx > 0U) {
            sycc_to_rgb(offset, upb, *y, 0, 0, r, g, b);
            ++y;
            ++r;
            ++g;
            ++b;
        }

        for (j = 0U; j < (loopmaxw & ~(size_t)1U); j += 2U) {
            sycc_to_rgb(offset, upb, *y, *cb, *cr, r, g, b);
            ++y;
            ++r;
            ++g;
            ++b;
            sycc_to_rgb(offset, upb, *y, *cb, *cr, r, g, b);
            ++y;
            ++r;
            ++g;
            ++b;
            ++cb;
            ++cr;
        }
        if (j < loopmaxw) {
            sycc_to_rgb(offset, upb, *y, *cb, *cr, r, g, b);
            ++y;
            ++r;
            ++g;
            ++b;
            ++cb;
            ++cr;
        }
    }

    opj_image_data_free(img->comps[0].data);
    img->comps[0].data = d0;
    opj_image_data_free(img->comps[1].data);
    img->comps[1].data = d1;
    opj_image_data_free(img->comps[2].data);
    img->comps[2].data = d2;

    img->comps[1].w = img->comps[2].w = img->comps[0].w;
    img->comps[1].h = img->comps[2].h = img->comps[0].h;
    img->comps[1].dx = img->comps[2].dx = img->comps[0].dx;
    img->comps[1].dy = img->comps[2].dy = img->comps[0].dy;
    img->color_space = OPJ_CLRSPC_SRGB;
    return;

fails:
    opj_image_data_free(r);
    opj_image_data_free(g);
    opj_image_data_free(b);
}